

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

string * __thiscall TileWire::toString_abi_cxx11_(string *__return_storage_ptr__,TileWire *this)

{
  Type TVar1;
  pointer pbVar2;
  
  TVar1 = this->_type;
  if ((long)(int)TVar1 == 0) {
    pbVar2 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (long)(int)this->_state1 + (long)(int)(this->super_Tile)._direction * 3 + -1;
  }
  else if ((int)TVar1 < 3) {
    pbVar2 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (long)(int)this->_state1 + (long)(int)(this->super_Tile)._direction * 3 +
             (long)(int)TVar1 * 0xc + -7;
  }
  else if (TVar1 == JUNCTION) {
    pbVar2 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)(int)this->_state1 + 0x1d;
  }
  else {
    pbVar2 = WIRE_SYMBOL_TABLE_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (int)(this->_state2 * 3 + this->_state1 + 0x1d);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

string TileWire::toString() const {
    if (_type == STRAIGHT) {
        return WIRE_SYMBOL_TABLE[_direction * 3 + _state1 - 1];
    } else if (_type < JUNCTION) {
        return WIRE_SYMBOL_TABLE[-6 + _type * 12 + _direction * 3 + _state1 - 1];
    } else if (_type == JUNCTION) {
        return WIRE_SYMBOL_TABLE[30 + _state1 - 1];
    } else {
        return WIRE_SYMBOL_TABLE[33 + _state1 - 1 + (_state2 - 1) * 3];
    }
}